

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void Curl_expire(Curl_easy *data,time_t milli,expire_id id)

{
  curl_llist *list;
  curltime *pcVar1;
  int iVar2;
  Curl_multi *pCVar3;
  curl_llist_element *pcVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  time_node *ptVar9;
  uint uVar10;
  size_t sVar11;
  timediff_t tVar12;
  Curl_tree *pCVar13;
  curl_llist *pcVar14;
  int iVar15;
  curl_llist_element *e;
  time_node *ne;
  long lVar16;
  curltime cVar17;
  curltime i;
  curltime newer;
  curltime older;
  curltime older_00;
  
  pCVar3 = data->multi;
  if (pCVar3 != (Curl_multi *)0x0) {
    cVar17 = Curl_now();
    iVar15 = (int)(milli % 1000) * 1000;
    iVar2 = cVar17.tv_usec + iVar15;
    iVar15 = cVar17.tv_usec + -1000000 + iVar15;
    if (iVar2 < 1000000) {
      iVar15 = iVar2;
    }
    lVar16 = (ulong)(999999 < iVar2) + cVar17.tv_sec + milli / 1000;
    multi_deltimeout(data,id);
    list = &(data->state).timeoutlist;
    ne = (data->state).expires + id;
    (data->state).expires[id].time.tv_sec = lVar16;
    (data->state).expires[id].time.tv_usec = iVar15;
    (data->state).expires[id].eid = id;
    sVar11 = Curl_llist_count(list);
    if (sVar11 == 0) {
      e = (curl_llist_element *)0x0;
    }
    else {
      pcVar14 = list;
      pcVar4 = (curl_llist_element *)0x0;
      do {
        e = pcVar4;
        pcVar4 = pcVar14->head;
        if (pcVar4 == (curl_llist_element *)0x0) break;
        ptVar9 = (data->state).expires + id;
        uVar5 = (ptVar9->time).tv_sec;
        uVar6 = (ptVar9->time).tv_usec;
        older.tv_usec = uVar6;
        older.tv_sec = uVar5;
        cVar17._12_4_ = 0;
        cVar17._0_12_ = *(undefined1 (*) [12])((long)pcVar4->ptr + 0x18);
        older._12_4_ = 0;
        tVar12 = Curl_timediff(cVar17,older);
        pcVar14 = (curl_llist *)&pcVar4->next;
      } while (tVar12 < 1);
    }
    Curl_llist_insert_next(list,e,ne,&ne->list);
    pcVar1 = &(data->state).expiretime;
    uVar7 = pcVar1->tv_sec;
    uVar8 = pcVar1->tv_usec;
    older_00.tv_usec = uVar8;
    older_00.tv_sec = uVar7;
    if (pcVar1->tv_sec != 0 || (data->state).expiretime.tv_usec != 0) {
      newer.tv_usec = iVar15;
      newer.tv_sec = lVar16;
      newer._12_4_ = 0;
      older_00._12_4_ = 0;
      tVar12 = Curl_timediff(newer,older_00);
      if (0 < tVar12) {
        return;
      }
      uVar10 = Curl_splayremovebyaddr(pCVar3->timetree,&(data->state).timenode,&pCVar3->timetree);
      if (uVar10 != 0) {
        Curl_infof(data,"Internal error removing splay node = %d\n",(ulong)uVar10);
      }
    }
    (data->state).expiretime.tv_sec = lVar16;
    (data->state).expiretime.tv_usec = iVar15;
    (data->state).timenode.payload = data;
    i.tv_usec = iVar15;
    i.tv_sec = lVar16;
    i._12_4_ = 0;
    pCVar13 = Curl_splayinsert(i,pCVar3->timetree,&(data->state).timenode);
    pCVar3->timetree = pCVar13;
  }
  return;
}

Assistant:

void Curl_expire(struct Curl_easy *data, time_t milli, expire_id id)
{
  struct Curl_multi *multi = data->multi;
  struct curltime *nowp = &data->state.expiretime;
  struct curltime set;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  DEBUGASSERT(id < EXPIRE_LAST);

  set = Curl_now();
  set.tv_sec += milli/1000;
  set.tv_usec += (unsigned int)(milli%1000)*1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  /* Remove any timer with the same id just in case. */
  multi_deltimeout(data, id);

  /* Add it to the timer list.  It must stay in the list until it has expired
     in case we need to recompute the minimum timer later. */
  multi_addtimeout(data, &set, id);

  if(nowp->tv_sec || nowp->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
       is. */
    timediff_t diff = Curl_timediff(set, *nowp);
    int rc;

    if(diff > 0) {
      /* The current splay tree entry is sooner than this new expiry time.
         We don't need to update our splay tree entry. */
      return;
    }

    /* Since this is an updated time, we must remove the previous entry from
       the splay tree first and then re-add the new value */
    rc = Curl_splayremovebyaddr(multi->timetree,
                                &data->state.timenode,
                                &multi->timetree);
    if(rc)
      infof(data, "Internal error removing splay node = %d\n", rc);
  }

  /* Indicate that we are in the splay tree and insert the new timer expiry
     value since it is our local minimum. */
  *nowp = set;
  data->state.timenode.payload = data;
  multi->timetree = Curl_splayinsert(*nowp, multi->timetree,
                                     &data->state.timenode);
}